

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

reference __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::(anonymous_namespace)::JsonNameDetails>_>_>
::iterator::operator*(iterator *this)

{
  size_t __n;
  size_t sVar1;
  int iVar2;
  reference in_RAX;
  long *plVar3;
  long *in_RSI;
  char *__s2;
  undefined1 *puStack_158;
  undefined8 uStack_150;
  undefined1 uStack_148;
  undefined7 uStack_147;
  ulong uStack_138;
  char *pcStack_130;
  ulong uStack_128;
  char *pcStack_120;
  undefined1 auStack_118 [80];
  AlphaNum AStack_c8;
  undefined1 auStack_98 [32];
  long lStack_78;
  code *pcStack_70;
  ulong *puStack_68;
  code *pcStack_60;
  ulong uStack_58;
  code *pcStack_50;
  undefined1 **ppuStack_48;
  code *pcStack_40;
  
  if (this == (iterator *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
    ::iterator::operator*((iterator *)0x0);
LAB_00206066:
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
    ::iterator::operator*((iterator *)this);
  }
  else {
    if (this == (iterator *)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<double>
       ) goto LAB_00206066;
    if (-1 < *(char *)&this->ctrl_) {
      return in_RAX;
    }
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::(anonymous_namespace)::JsonNameDetails>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::(anonymous_namespace)::JsonNameDetails>>>
  ::iterator::operator*((iterator *)this);
  lStack_78 = *in_RSI;
  pcStack_130 = "default";
  pcStack_120 = "default";
  if ((ulong)*(byte *)(lStack_78 + 0x28) != 0) {
    pcStack_120 = "custom";
  }
  uStack_128 = (ulong)*(byte *)(lStack_78 + 0x28) ^ 7;
  plVar3 = (long *)in_RSI[1];
  if ((ulong)*(byte *)(plVar3 + 5) != 0) {
    pcStack_130 = "custom";
  }
  uStack_138 = (ulong)*(byte *)(plVar3 + 5) ^ 7;
  puStack_158 = &uStack_148;
  uStack_150 = 0;
  uStack_148 = 0;
  __n = *(size_t *)(lStack_78 + 0x10);
  sVar1 = plVar3[2];
  if (__n == sVar1) {
    if (__n == 0) goto LAB_00206196;
    __s2 = (char *)plVar3[1];
    iVar2 = bcmp(*(void **)(lStack_78 + 8),__s2,__n);
    if (iVar2 == 0) goto LAB_00206196;
  }
  else {
    __s2 = (char *)plVar3[1];
  }
  auStack_98._0_8_ = 3;
  auStack_98._8_8_ = " (\"";
  auStack_118[0x20] = '\x02';
  auStack_118[0x21] = '\0';
  auStack_118[0x22] = '\0';
  auStack_118[0x23] = '\0';
  auStack_118[0x24] = '\0';
  auStack_118[0x25] = '\0';
  auStack_118[0x26] = '\0';
  auStack_118[0x27] = '\0';
  auStack_118._40_8_ = "\")";
  AStack_c8.piece_._M_len = sVar1;
  AStack_c8.piece_._M_str = __s2;
  absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)auStack_118,(AlphaNum *)auStack_98,&AStack_c8);
  std::__cxx11::string::operator=((string *)&puStack_158,(string *)auStack_118);
  if ((undefined1 *)auStack_118._0_8_ != auStack_118 + 0x10) {
    operator_delete((void *)auStack_118._0_8_,auStack_118._16_8_ + 1);
  }
  lStack_78 = *in_RSI;
  plVar3 = (long *)in_RSI[1];
LAB_00206196:
  auStack_98._16_8_ = *(ulong *)(in_RSI[2] + 0x18) & 0xfffffffffffffffc;
  uStack_58 = *(ulong *)(*plVar3 + 0x18) & 0xfffffffffffffffc;
  lStack_78 = lStack_78 + 8;
  auStack_98._0_8_ = &uStack_128;
  auStack_98._8_8_ =
       absl::lts_20240722::str_format_internal::FormatArgImpl::
       Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  auStack_98._24_8_ =
       absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<std::__cxx11::string>;
  pcStack_70 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::__cxx11::string>;
  puStack_68 = &uStack_138;
  pcStack_60 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
  pcStack_50 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::__cxx11::string>;
  ppuStack_48 = &puStack_158;
  pcStack_40 = absl::lts_20240722::str_format_internal::FormatArgImpl::
               Dispatch<std::__cxx11::string>;
  absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
            (this,
             "The %s JSON name of field \"%s\" (\"%s\") conflicts with the %s JSON name of field \"%s\"%s."
             ,0x56,auStack_98,6);
  if (puStack_158 != &uStack_148) {
    operator_delete(puStack_158,CONCAT71(uStack_147,uStack_148) + 1);
  }
  return (reference)this;
}

Assistant:

reference operator*() const {
      AssertIsFull(ctrl_, generation(), generation_ptr(), "operator*()");
      return unchecked_deref();
    }